

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityCapabilities.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::EntityCapabilities::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EntityCapabilities *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Entity Capabilities",0x13);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tAmmunition Supply:    ",0x18);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tFuel Supply:          ",0x18);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tRecovery Service:     ",0x18);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tRepair Service:       ",0x18);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tADS-B Service:        ",0x18);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString EntityCapabilities::GetAsString() const
{
    KStringStream ss;

    ss << "Entity Capabilities"
       << "\n\tAmmunition Supply:    " << m_AmmunitionSupply
       << "\n\tFuel Supply:          " << m_FuelSupply
       << "\n\tRecovery Service:     " << m_RecoveryService
       << "\n\tRepair Service:       " << m_RepairService
	   << "\n\tADS-B Service:        " << m_ADSB
       << "\n";

    return ss.str();
}